

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O2

void __thiscall
de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>_>::SharedPtr
          (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>_> *this,
          Unique<vk::Handle<(vk::HandleType)12>_> *ptr)

{
  SharedPtrStateBase *pSVar1;
  
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  pSVar1 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar1->strongRefCount = 0;
  pSVar1->weakRefCount = 0;
  pSVar1->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00bca2b0;
  pSVar1[1]._vptr_SharedPtrStateBase = (_func_int **)ptr;
  this->m_state = pSVar1;
  pSVar1->strongRefCount = 1;
  pSVar1->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}